

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_models.cpp
# Opt level: O3

FModelVertex * __thiscall FModelVertexBuffer::LockVertexBuffer(FModelVertexBuffer *this,uint size)

{
  GLuint GVar1;
  long lVar2;
  ulong __n;
  FModelVertex *pFVar3;
  
  GVar1 = (this->super_FVertexBuffer).vbo_id;
  if (GVar1 == 0) {
    if (this->vbo_ptr != (FModelVertex *)0x0) {
      operator_delete__(this->vbo_ptr);
    }
    __n = (ulong)size * 0x14;
    pFVar3 = (FModelVertex *)operator_new__(__n);
    this->vbo_ptr = pFVar3;
    pFVar3 = (FModelVertex *)memset(pFVar3,0,__n);
    return pFVar3;
  }
  (*_ptrc_glBindBuffer)(0x8892,GVar1);
  lVar2 = (ulong)size * 0x14;
  (*_ptrc_glBufferData)(0x8892,lVar2,(void *)0x0,0x88e4);
  if (gl.legacyMode != false) {
    pFVar3 = (FModelVertex *)(*_ptrc_glMapBuffer)(0x8892,0x88b9);
    return pFVar3;
  }
  pFVar3 = (FModelVertex *)(*_ptrc_glMapBufferRange)(0x8892,0,lVar2,10);
  return pFVar3;
}

Assistant:

FModelVertex *FModelVertexBuffer::LockVertexBuffer(unsigned int size)
{
	if (vbo_id > 0)
	{
		glBindBuffer(GL_ARRAY_BUFFER, vbo_id);
		glBufferData(GL_ARRAY_BUFFER, size * sizeof(FModelVertex), nullptr, GL_STATIC_DRAW);
		if (!gl.legacyMode)
			return (FModelVertex*)glMapBufferRange(GL_ARRAY_BUFFER, 0, size * sizeof(FModelVertex), GL_MAP_WRITE_BIT | GL_MAP_INVALIDATE_BUFFER_BIT);
		else
			return (FModelVertex*)glMapBuffer(GL_ARRAY_BUFFER, GL_WRITE_ONLY);
	}
	else
	{
		if (vbo_ptr != nullptr) delete[] vbo_ptr;
		vbo_ptr = new FModelVertex[size];
		memset(vbo_ptr, 0, size * sizeof(FModelVertex));
		return vbo_ptr;
	}
}